

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O0

void If_LibBoxAdd(If_LibBox_t *p,If_Box_t *pBox)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  If_Box_t *pBox_local;
  If_LibBox_t *p_local;
  
  iVar1 = pBox->Id;
  iVar2 = Vec_PtrSize(p->vBoxes);
  if (iVar2 <= iVar1) {
    Vec_PtrFillExtra(p->vBoxes,pBox->Id * 2 + 10,(void *)0x0);
  }
  pvVar3 = Vec_PtrEntry(p->vBoxes,pBox->Id);
  if (pvVar3 == (void *)0x0) {
    Vec_PtrWriteEntry(p->vBoxes,pBox->Id,pBox);
    p->nBoxes = p->nBoxes + 1;
    return;
  }
  __assert_fail("Vec_PtrEntry( p->vBoxes, pBox->Id ) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifLibBox.c"
                ,0x8c,"void If_LibBoxAdd(If_LibBox_t *, If_Box_t *)");
}

Assistant:

void If_LibBoxAdd( If_LibBox_t * p, If_Box_t * pBox )
{
    if ( pBox->Id >= Vec_PtrSize(p->vBoxes) )
        Vec_PtrFillExtra( p->vBoxes, 2 * pBox->Id + 10, NULL );
    assert( Vec_PtrEntry( p->vBoxes, pBox->Id ) == NULL );
    Vec_PtrWriteEntry( p->vBoxes, pBox->Id, pBox );
    p->nBoxes++;
}